

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDependsFortran.cxx
# Opt level: O2

bool __thiscall
cmDependsFortran::Finalize(cmDependsFortran *this,ostream *makeDepends,ostream *internalDepends)

{
  _Rb_tree_node_base *p_Var1;
  cmMakefile *this_00;
  size_type sVar2;
  cmDependsFortranInternals *pcVar3;
  bool bVar4;
  string *psVar5;
  string *psVar6;
  _Base_ptr p_Var7;
  ostream *poVar8;
  _Rb_tree_node_base *p_Var9;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1;
  string mod_dir;
  string stamp;
  string mod_upper;
  string fcName;
  string fiName;
  string local_580;
  string local_560;
  string mod_lower;
  string local_520;
  cmGeneratedFileStream fiStream;
  cmGeneratedFileStream fcStream;
  
  bVar4 = LocateModules(this);
  if (bVar4) {
    this_00 = (((this->super_cmDepends).LocalGenerator)->super_cmLocalCommonGenerator).
              super_cmLocalGenerator.Makefile;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&fiStream,"CMAKE_Fortran_TARGET_MODULE_DIR",(allocator<char> *)&fcStream);
    psVar5 = cmMakefile::GetSafeDefinition(this_00,(string *)&fiStream);
    std::__cxx11::string::string((string *)&mod_dir,(string *)psVar5);
    std::__cxx11::string::~string((string *)&fiStream);
    if (mod_dir._M_string_length == 0) {
      cmLocalGenerator::GetCurrentBinaryDirectory_abi_cxx11_
                ((cmLocalGenerator *)(this->super_cmDepends).LocalGenerator);
      std::__cxx11::string::_M_assign((string *)&mod_dir);
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&fiStream,"CMAKE_Fortran_TARGET_BUILDING_INSTRINSIC_MODULES",
               (allocator<char> *)&fcStream);
    psVar6 = cmMakefile::GetSafeDefinition(this_00,(string *)&fiStream);
    psVar5 = &(this->super_cmDepends).TargetDirectory;
    sVar2 = psVar6->_M_string_length;
    std::__cxx11::string::~string((string *)&fiStream);
    pcVar3 = (this->Internal)._M_t.
             super___uniq_ptr_impl<cmDependsFortranInternals,_std::default_delete<cmDependsFortranInternals>_>
             ._M_t.
             super__Tuple_impl<0UL,_cmDependsFortranInternals_*,_std::default_delete<cmDependsFortranInternals>_>
             .super__Head_base<0UL,_cmDependsFortranInternals_*,_false>._M_head_impl;
    for (p_Var7 = *(_Base_ptr *)((long)&(pcVar3->ObjectInfo)._M_t + 0x18);
        p_Var7 != (_Rb_tree_node_base *)((long)&(pcVar3->ObjectInfo)._M_t + 8U);
        p_Var7 = (_Base_ptr)std::_Rb_tree_increment(p_Var7)) {
      WriteDependenciesReal
                (this,(string *)(p_Var7 + 1),(cmFortranSourceInfo *)(p_Var7 + 2),&mod_dir,psVar5,
                 makeDepends,internalDepends,sVar2 != 0);
    }
    cmStrCat<std::__cxx11::string&,char_const(&)[18]>
              (&fiName,psVar5,(char (*) [18])"/fortran.internal");
    cmGeneratedFileStream::cmGeneratedFileStream(&fiStream,&fiName,false,None);
    std::operator<<((ostream *)&fiStream,"# The fortran modules provided by this target.\n");
    std::operator<<((ostream *)&fiStream,"provides\n");
    pcVar3 = (this->Internal)._M_t.
             super___uniq_ptr_impl<cmDependsFortranInternals,_std::default_delete<cmDependsFortranInternals>_>
             ._M_t.
             super__Tuple_impl<0UL,_cmDependsFortranInternals_*,_std::default_delete<cmDependsFortranInternals>_>
             .super__Head_base<0UL,_cmDependsFortranInternals_*,_false>._M_head_impl;
    p_Var1 = (_Rb_tree_node_base *)((long)&(pcVar3->TargetProvides)._M_t + 8);
    for (p_Var7 = *(_Base_ptr *)((long)&(pcVar3->TargetProvides)._M_t + 0x18); p_Var7 != p_Var1;
        p_Var7 = (_Base_ptr)std::_Rb_tree_increment(p_Var7)) {
      poVar8 = std::operator<<((ostream *)&fiStream,' ');
      poVar8 = std::operator<<(poVar8,(string *)(p_Var7 + 1));
      std::operator<<(poVar8,'\n');
    }
    if (*(size_t *)((long)&(pcVar3->TargetProvides)._M_t + 0x28) != 0) {
      cmStrCat<std::__cxx11::string&,char_const(&)[27]>
                (&fcName,psVar5,(char (*) [27])"/cmake_clean_Fortran.cmake");
      cmGeneratedFileStream::cmGeneratedFileStream(&fcStream,&fcName,false,None);
      std::operator<<((ostream *)&fcStream,"# Remove fortran modules provided by this target.\n");
      std::operator<<((ostream *)&fcStream,"FILE(REMOVE");
      for (p_Var9 = *(_Base_ptr *)((long)&(pcVar3->TargetProvides)._M_t + 0x18); p_Var9 != p_Var1;
          p_Var9 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var9)) {
        mod_lower._M_dataplus._M_p._0_1_ = 0x2f;
        cmStrCat<std::__cxx11::string&,char>(&mod_upper,&mod_dir,(char *)&mod_lower);
        stamp._M_dataplus._M_p._0_1_ = 0x2f;
        cmStrCat<std::__cxx11::string&,char>(&mod_lower,&mod_dir,(char *)&stamp);
        cmFortranModuleAppendUpperLower((string *)(p_Var9 + 1),&mod_upper,&mod_lower);
        local_560._M_dataplus._M_p._0_1_ = 0x2f;
        cmStrCat<std::__cxx11::string_const&,char,std::__cxx11::string_const&,char_const(&)[7]>
                  (&stamp,psVar5,(char *)&local_560,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(p_Var9 + 1)
                   ,(char (*) [7])".stamp");
        poVar8 = std::operator<<((ostream *)&fcStream,"\n  \"");
        cmOutputConverter::MaybeRelativeToCurBinDir
                  (&local_560,(cmOutputConverter *)(this->super_cmDepends).LocalGenerator,&mod_lower
                  );
        poVar8 = std::operator<<(poVar8,(string *)&local_560);
        poVar8 = std::operator<<(poVar8,"\"\n  \"");
        cmOutputConverter::MaybeRelativeToCurBinDir
                  (&local_580,(cmOutputConverter *)(this->super_cmDepends).LocalGenerator,&mod_upper
                  );
        poVar8 = std::operator<<(poVar8,(string *)&local_580);
        poVar8 = std::operator<<(poVar8,"\"\n  \"");
        cmOutputConverter::MaybeRelativeToCurBinDir
                  (&local_520,(cmOutputConverter *)(this->super_cmDepends).LocalGenerator,&stamp);
        poVar8 = std::operator<<(poVar8,(string *)&local_520);
        std::operator<<(poVar8,"\"\n");
        std::__cxx11::string::~string((string *)&local_520);
        std::__cxx11::string::~string((string *)&local_580);
        std::__cxx11::string::~string((string *)&local_560);
        std::__cxx11::string::~string((string *)&stamp);
        std::__cxx11::string::~string((string *)&mod_lower);
        std::__cxx11::string::~string((string *)&mod_upper);
      }
      std::operator<<((ostream *)&fcStream,"  )\n");
      cmGeneratedFileStream::~cmGeneratedFileStream(&fcStream);
      std::__cxx11::string::~string((string *)&fcName);
    }
    cmGeneratedFileStream::~cmGeneratedFileStream(&fiStream);
    std::__cxx11::string::~string((string *)&fiName);
    std::__cxx11::string::~string((string *)&mod_dir);
  }
  return bVar4;
}

Assistant:

bool cmDependsFortran::Finalize(std::ostream& makeDepends,
                                std::ostream& internalDepends)
{
  // Prepare the module search process.
  if (!this->LocateModules()) {
    return false;
  }

  // Get the directory in which stamp files will be stored.
  const std::string& stamp_dir = this->TargetDirectory;

  // Get the directory in which module files will be created.
  cmMakefile* mf = this->LocalGenerator->GetMakefile();
  std::string mod_dir =
    mf->GetSafeDefinition("CMAKE_Fortran_TARGET_MODULE_DIR");
  if (mod_dir.empty()) {
    mod_dir = this->LocalGenerator->GetCurrentBinaryDirectory();
  }

  bool building_intrinsics =
    !mf->GetSafeDefinition("CMAKE_Fortran_TARGET_BUILDING_INSTRINSIC_MODULES")
       .empty();

  // Actually write dependencies to the streams.
  using ObjectInfoMap = cmDependsFortranInternals::ObjectInfoMap;
  ObjectInfoMap const& objInfo = this->Internal->ObjectInfo;
  for (auto const& i : objInfo) {
    if (!this->WriteDependenciesReal(i.first, i.second, mod_dir, stamp_dir,
                                     makeDepends, internalDepends,
                                     building_intrinsics)) {
      return false;
    }
  }

  // Store the list of modules provided by this target.
  std::string fiName = cmStrCat(this->TargetDirectory, "/fortran.internal");
  cmGeneratedFileStream fiStream(fiName);
  fiStream << "# The fortran modules provided by this target.\n";
  fiStream << "provides\n";
  std::set<std::string> const& provides = this->Internal->TargetProvides;
  for (std::string const& i : provides) {
    fiStream << ' ' << i << '\n';
  }

  // Create a script to clean the modules.
  if (!provides.empty()) {
    std::string fcName =
      cmStrCat(this->TargetDirectory, "/cmake_clean_Fortran.cmake");
    cmGeneratedFileStream fcStream(fcName);
    fcStream << "# Remove fortran modules provided by this target.\n";
    fcStream << "FILE(REMOVE";
    for (std::string const& i : provides) {
      std::string mod_upper = cmStrCat(mod_dir, '/');
      std::string mod_lower = cmStrCat(mod_dir, '/');
      cmFortranModuleAppendUpperLower(i, mod_upper, mod_lower);
      std::string stamp = cmStrCat(stamp_dir, '/', i, ".stamp");
      fcStream << "\n"
                  "  \""
               << this->LocalGenerator->MaybeRelativeToCurBinDir(mod_lower)
               << "\"\n"
                  "  \""
               << this->LocalGenerator->MaybeRelativeToCurBinDir(mod_upper)
               << "\"\n"
                  "  \""
               << this->LocalGenerator->MaybeRelativeToCurBinDir(stamp)
               << "\"\n";
    }
    fcStream << "  )\n";
  }
  return true;
}